

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPSocket.cpp
# Opt level: O1

void __thiscall net_uv::KCPSocket::~KCPSocket(KCPSocket *this)

{
  ~KCPSocket(this);
  operator_delete(this,0x148);
  return;
}

Assistant:

KCPSocket::~KCPSocket()
{
	FC_SAFE_FREE(m_socketAddr);
	FC_SAFE_FREE(m_recvBuf);

	assert(m_udp == NULL);

	if (m_socketMng != NULL && !m_weakRefTag)
	{
		m_socketMng->~KCPSocketManager();
		fc_free(m_socketMng);
		m_socketMng = NULL;
	}
}